

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# components.hpp
# Opt level: O0

void __thiscall cs::exception::~exception(exception *this)

{
  exception *in_RDI;
  
  ~exception(in_RDI);
  operator_delete(in_RDI,0x90);
  return;
}

Assistant:

~exception() override = default;